

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

int Zyx_ManAddCnfLazyFunc(Zyx_Man_t *p,int iMint)

{
  Bmc_EsPar_t *pBVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  int (*paiVar8) [32];
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  int (*paiVar14) [32];
  
  pBVar1 = p->pPars;
  if ((pBVar1->fMajority != 0) || (3 < pBVar1->nLutSize)) {
    __assert_fail("!p->pPars->fMajority && p->pPars->nLutSize < 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                  ,0x427,"int Zyx_ManAddCnfLazyFunc(Zyx_Man_t *, int)");
  }
  p->Counts[iMint] = p->Counts[iMint] + 1;
  if (pBVar1->nLutSize == 3) {
    lVar13 = (long)pBVar1->nVars;
    paiVar14 = p->pFanins + lVar13;
    while( true ) {
      iVar12 = (int)lVar13;
      iVar5 = 0;
      if (0 < iVar12) {
        iVar5 = iVar12;
      }
      if (p->nObjs <= lVar13) break;
      paiVar8 = p->pFanins + lVar13;
      iVar3 = 0;
      while (iVar9 = iVar3, iVar9 != iVar5) {
        iVar3 = iVar9 + 1;
        while (iVar10 = iVar3, iVar3 = iVar9 + 1, iVar10 < lVar13) {
          for (iVar2 = iVar10 + 1; iVar3 = iVar10 + 1, iVar2 < lVar13; iVar2 = iVar2 + 1) {
            (*paiVar8)[0] = iVar9;
            (*paiVar8)[1] = iVar10;
            (*paiVar8)[2] = iVar2;
            for (uVar11 = 0; (int)uVar11 <= p->LutMask; uVar11 = uVar11 + 1) {
              uVar6 = 0;
              while (uVar6 != 2) {
                p->nLits[0] = 0;
                iVar4 = Abc_Var2Lit((iVar12 - p->pPars->nVars) * (p->LutMask + 1) + uVar11,uVar6);
                iVar3 = p->nLits[0];
                p->nLits[0] = iVar3 + 1;
                p->pLits[0][iVar3] = iVar4;
                for (lVar7 = 0; lVar7 < p->pPars->nLutSize; lVar7 = lVar7 + 1) {
                  iVar4 = Abc_Var2Lit(p->TopoBase + (*paiVar14)[lVar7] +
                                      (iVar12 - p->pPars->nVars) * p->nObjs,1);
                  iVar3 = p->nLits[0];
                  p->nLits[0] = iVar3 + 1;
                  p->pLits[0][iVar3] = iVar4;
                  iVar4 = Abc_Var2Lit(p->MintBase + (*paiVar14)[lVar7] + p->nObjs * iMint,
                                      (uint)((uVar11 >> ((uint)lVar7 & 0x1f) & 1) != 0));
                  iVar3 = p->nLits[0];
                  p->nLits[0] = iVar3 + 1;
                  p->pLits[0][iVar3] = iVar4;
                }
                iVar4 = Abc_Var2Lit(p->MintBase + iVar12 + p->nObjs * iMint,uVar6 ^ 1);
                iVar3 = p->nLits[0];
                p->nLits[0] = iVar3 + 1;
                p->pLits[0][iVar3] = iVar4;
                iVar3 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
                uVar6 = uVar6 + 1;
                if (iVar3 == 0) {
                  return 0;
                }
              }
            }
          }
        }
      }
      lVar13 = lVar13 + 1;
      paiVar14 = paiVar14 + 1;
    }
  }
  else if (pBVar1->nLutSize == 2) {
    lVar13 = (long)pBVar1->nVars;
    paiVar14 = p->pFanins + lVar13;
    while( true ) {
      iVar12 = (int)lVar13;
      iVar5 = 0;
      if (0 < iVar12) {
        iVar5 = iVar12;
      }
      if (p->nObjs <= lVar13) break;
      iVar3 = 0;
      while (iVar9 = iVar3, iVar9 != iVar5) {
        for (iVar10 = iVar9 + 1; iVar3 = iVar9 + 1, iVar10 < lVar13; iVar10 = iVar10 + 1) {
          p->pFanins[lVar13][0] = iVar9;
          p->pFanins[lVar13][1] = iVar10;
          for (uVar11 = 0; (int)uVar11 <= p->LutMask; uVar11 = uVar11 + 1) {
            uVar6 = 0;
            while (uVar6 != 2) {
              p->nLits[0] = 0;
              iVar2 = Abc_Var2Lit((iVar12 - p->pPars->nVars) * (p->LutMask + 1) + uVar11,uVar6);
              iVar3 = p->nLits[0];
              p->nLits[0] = iVar3 + 1;
              p->pLits[0][iVar3] = iVar2;
              for (lVar7 = 0; lVar7 < p->pPars->nLutSize; lVar7 = lVar7 + 1) {
                iVar2 = Abc_Var2Lit(p->TopoBase + (*paiVar14)[lVar7] +
                                    (iVar12 - p->pPars->nVars) * p->nObjs,1);
                iVar3 = p->nLits[0];
                p->nLits[0] = iVar3 + 1;
                p->pLits[0][iVar3] = iVar2;
                iVar2 = Abc_Var2Lit(p->MintBase + (*paiVar14)[lVar7] + p->nObjs * iMint,
                                    (uint)((uVar11 >> ((uint)lVar7 & 0x1f) & 1) != 0));
                iVar3 = p->nLits[0];
                p->nLits[0] = iVar3 + 1;
                p->pLits[0][iVar3] = iVar2;
              }
              iVar2 = Abc_Var2Lit(p->MintBase + iVar12 + p->nObjs * iMint,uVar6 ^ 1);
              iVar3 = p->nLits[0];
              p->nLits[0] = iVar3 + 1;
              p->pLits[0][iVar3] = iVar2;
              iVar3 = bmcg_sat_solver_addclause(p->pSat,p->pLits[0],p->nLits[0]);
              uVar6 = uVar6 + 1;
              if (iVar3 == 0) {
                return 0;
              }
            }
          }
        }
      }
      lVar13 = lVar13 + 1;
      paiVar14 = paiVar14 + 1;
    }
  }
  return 1;
}

Assistant:

int Zyx_ManAddCnfLazyFunc( Zyx_Man_t * p, int iMint )
{
    int i, k, n, j, s, t, u;
    //printf( "Adding clauses for minterm %d with value %d.\n", iMint, Value );
    assert( !p->pPars->fMajority && p->pPars->nLutSize < 4 );
    p->Counts[iMint]++;
    if ( p->pPars->nLutSize == 2 )
    {
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( s = 0;               s < i;        s++ )
        for ( t = s+1;             t < i;        t++ )
        {
            p->pFanins[i][0] = s;
            p->pFanins[i][1] = t;
            for ( k = 0; k <= p->LutMask; k++ )
            for ( n = 0; n < 2; n++ )
            {
                p->nLits[0] = 0;
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_FuncVar(p, i, k), n );
                for ( j = 0; j < p->pPars->nLutSize; j++ )
                {
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_TopoVar(p, i, p->pFanins[i][j]), 1 );
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, p->pFanins[i][j]), (k >> j) & 1 );
                }
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, i), !n );
                if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                    return 0;
            }
        }
    }
    else if ( p->pPars->nLutSize == 3 )
    {
        for ( i = p->pPars->nVars; i < p->nObjs; i++ )
        for ( s = 0;               s < i;        s++ )
        for ( t = s+1;             t < i;        t++ )
        for ( u = t+1;             u < i;        u++ )
        {
            p->pFanins[i][0] = s;
            p->pFanins[i][1] = t;
            p->pFanins[i][2] = u;
            for ( k = 0; k <= p->LutMask; k++ )
            for ( n = 0; n < 2; n++ )
            {
                p->nLits[0] = 0;
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_FuncVar(p, i, k), n );
                for ( j = 0; j < p->pPars->nLutSize; j++ )
                {
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_TopoVar(p, i, p->pFanins[i][j]), 1 );
                    p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, p->pFanins[i][j]), (k >> j) & 1 );
                }
                p->pLits[0][p->nLits[0]++] = Abc_Var2Lit( Zyx_MintVar(p, iMint, i), !n );
                if ( !bmcg_sat_solver_addclause( p->pSat, p->pLits[0], p->nLits[0] ) )
                    return 0;
            }
        }
    }
    return 1;
}